

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O3

void decSetCoeff(decNumber *dn,decContext *set,uint8_t *lsu,int32_t len,int32_t *residue,
                uint32_t *status)

{
  byte bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint8_t uVar5;
  int iVar6;
  uint uVar7;
  int32_t iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  
  uVar7 = set->digits;
  iVar6 = len - uVar7;
  if (iVar6 == 0 || len < (int)uVar7) {
    if (dn->lsu != lsu) {
      if (0 < len) {
        uVar7 = len + 1;
        lVar14 = 0;
        do {
          dn->lsu[lVar14] = lsu[lVar14];
          lVar14 = lVar14 + 1;
          uVar7 = uVar7 - 1;
        } while (1 < uVar7);
      }
      dn->digits = len;
    }
    if (*residue != 0) {
      *status = *status | 0x820;
    }
    return;
  }
  dn->exponent = dn->exponent + iVar6;
  *(byte *)((long)status + 1) = *(byte *)((long)status + 1) | 8;
  iVar11 = *residue;
  if (iVar11 < 2) {
    if ((int)uVar7 < 0) {
      if (iVar11 != 1) {
        if (0 < len) {
          iVar6 = len + 1;
          do {
            if (*lsu != '\0') {
              *residue = 1;
              goto LAB_00245396;
            }
            lsu = lsu + 1;
            iVar6 = iVar6 + -1;
          } while (1 < iVar6);
        }
        if (iVar11 == 0) goto LAB_0024539a;
      }
      goto LAB_00245396;
    }
  }
  else {
    *residue = 1;
    iVar11 = 1;
    if ((int)uVar7 < 0) {
LAB_00245396:
      *(byte *)status = (byte)*status | 0x20;
LAB_0024539a:
      dn->lsu[0] = '\0';
      dn->digits = 1;
      return;
    }
  }
  iVar12 = 0;
  if (iVar6 != 1) {
    iVar12 = ~uVar7 + len;
    do {
      if (*lsu != 0) {
        *residue = 1;
        iVar11 = 1;
      }
      lsu = lsu + 1;
      iVar12 = iVar12 + -1;
    } while (iVar12 != 0);
    iVar12 = iVar6 + -1;
  }
  uVar7 = iVar6 - iVar12;
  bVar1 = *lsu;
  uVar13 = (uint)bVar1;
  uVar9 = uVar7 - 1;
  if (uVar9 == 0) {
    if (bVar1 < 5) {
      iVar8 = 3;
      if (uVar13 != 0) goto LAB_00245354;
    }
    else {
      iVar8 = 7;
      if (uVar13 == 5) {
        iVar8 = iVar11 + 5;
      }
LAB_00245354:
      *residue = iVar8;
    }
    iVar6 = set->digits;
    if (0 < iVar6) {
      dn->digits = iVar6;
      uVar7 = iVar6 + 1;
      lVar14 = 0;
      do {
        dn->lsu[lVar14] = lsu[lVar14 + 1];
        lVar14 = lVar14 + 1;
        uVar7 = uVar7 - 1;
      } while (1 < uVar7);
      goto LAB_00245383;
    }
  }
  else {
    uVar10 = (uint)(bVar1 >> ((byte)uVar9 & 0x1f)) * multies[uVar9] >> 0x11;
    if (DECPOWERS[uVar9] * uVar10 != uVar13) {
      iVar11 = 1;
    }
    uVar9 = uVar10 * 0x199a >> 0x10;
    *residue = (uint)""[uVar10 + uVar9 * -10] + iVar11;
    iVar6 = set->digits;
    if (0 < iVar6) {
      dn->digits = iVar6;
      dn->lsu[0] = (uint8_t)(uVar10 * 0x199a >> 0x10);
      if (0 < (int)(iVar6 - (1 - uVar7))) {
        uVar2 = multies[uVar7];
        uVar3 = DECPOWERS[uVar7];
        uVar4 = DECPOWERS[1 - uVar7];
        lVar14 = 0;
        do {
          iVar6 = iVar6 + -1;
          uVar13 = (lsu[lVar14 + 1] >> ((byte)uVar7 & 0x1f)) * uVar2 >> 0x11;
          uVar5 = (uint8_t)uVar13;
          dn->lsu[lVar14] = (lsu[lVar14 + 1] - uVar5 * (char)uVar3) * (char)uVar4 + (char)uVar9;
          if (iVar6 < 1) break;
          dn->lsu[lVar14 + 1] = uVar5;
          lVar14 = lVar14 + 1;
          uVar9 = uVar13;
        } while (0 < (int)(uVar7 + iVar6 + -1));
      }
      goto LAB_00245383;
    }
  }
  dn->lsu[0] = '\0';
  dn->digits = 1;
LAB_00245383:
  if (*residue != 0) {
    *(byte *)status = (byte)*status | 0x20;
  }
  return;
}

Assistant:

static void decSetCoeff(decNumber *dn, decContext *set, const Unit *lsu,
                        Int len, Int *residue, uInt *status) {
  Int   discard;              /* number of digits to discard  */
  uInt  cut;                  /* cut point in Unit  */
  const Unit *up;             /* work  */
  Unit  *target;              /* ..  */
  Int   count;                /* ..  */
  #if DECDPUN<=4
  uInt  temp;                 /* ..  */
  #endif

  discard=len-set->digits;    /* digits to discard  */
  if (discard<=0) {           /* no digits are being discarded  */
    if (dn->lsu!=lsu) {       /* copy needed  */
      /* copy the coefficient array to the result number; no shift needed  */
      count=len;              /* avoids D2U  */
      up=lsu;
      for (target=dn->lsu; count>0; target++, up++, count-=DECDPUN)
        *target=*up;
      dn->digits=len;         /* set the new length  */
      }
    /* dn->exponent and residue are unchanged, record any inexactitude  */
    if (*residue!=0) *status|=(DEC_Inexact | DEC_Rounded);
    return;
    }

  /* some digits must be discarded ...  */
  dn->exponent+=discard;      /* maintain numerical value  */
  *status|=DEC_Rounded;       /* accumulate Rounded status  */
  if (*residue>1) *residue=1; /* previous residue now to right, so reduce  */

  if (discard>len) {          /* everything, +1, is being discarded  */
    /* guard digit is 0  */
    /* residue is all the number [NB could be all 0s]  */
    if (*residue<=0) {        /* not already positive  */
      count=len;              /* avoids D2U  */
      for (up=lsu; count>0; up++, count-=DECDPUN) if (*up!=0) { /* found non-0  */
        *residue=1;
        break;                /* no need to check any others  */
        }
      }
    if (*residue!=0) *status|=DEC_Inexact; /* record inexactitude  */
    *dn->lsu=0;               /* coefficient will now be 0  */
    dn->digits=1;             /* ..  */
    return;
    } /* total discard  */

  /* partial discard [most common case]  */
  /* here, at least the first (most significant) discarded digit exists  */

  /* spin up the number, noting residue during the spin, until get to  */
  /* the Unit with the first discarded digit.  When reach it, extract  */
  /* it and remember its position  */
  count=0;
  for (up=lsu;; up++) {
    count+=DECDPUN;
    if (count>=discard) break; /* full ones all checked  */
    if (*up!=0) *residue=1;
    } /* up  */

  /* here up -> Unit with first discarded digit  */
  cut=discard-(count-DECDPUN)-1;
  if (cut==DECDPUN-1) {       /* unit-boundary case (fast)  */
    Unit half=(Unit)powers[DECDPUN]>>1;
    /* set residue directly  */
    if (*up>=half) {
      if (*up>half) *residue=7;
      else *residue+=5;       /* add sticky bit  */
      }
     else { /* <half  */
      if (*up!=0) *residue=3; /* [else is 0, leave as sticky bit]  */
      }
    if (set->digits<=0) {     /* special for Quantize/Subnormal :-(  */
      *dn->lsu=0;             /* .. result is 0  */
      dn->digits=1;           /* ..  */
      }
     else {                   /* shift to least  */
      count=set->digits;      /* now digits to end up with  */
      dn->digits=count;       /* set the new length  */
      up++;                   /* move to next  */
      /* on unit boundary, so shift-down copy loop is simple  */
      for (target=dn->lsu; count>0; target++, up++, count-=DECDPUN)
        *target=*up;
      }
    } /* unit-boundary case  */

   else { /* discard digit is in low digit(s), and not top digit  */
    uInt  discard1;                /* first discarded digit  */
    uInt  quot, rem;               /* for divisions  */
    if (cut==0) quot=*up;          /* is at bottom of unit  */
     else /* cut>0 */ {            /* it's not at bottom of unit  */
      #if DECDPUN<=4
        U_ASSERT(/* cut >= 0 &&*/ cut <= 4);
        quot=QUOT10(*up, cut);
        rem=*up-quot*powers[cut];
      #else
        rem=*up%powers[cut];
        quot=*up/powers[cut];
      #endif
      if (rem!=0) *residue=1;
      }
    /* discard digit is now at bottom of quot  */
    #if DECDPUN<=4
      temp=(quot*6554)>>16;        /* fast /10  */
      /* Vowels algorithm here not a win (9 instructions)  */
      discard1=quot-X10(temp);
      quot=temp;
    #else
      discard1=quot%10;
      quot=quot/10;
    #endif
    /* here, discard1 is the guard digit, and residue is everything  */
    /* else [use mapping array to accumulate residue safely]  */
    *residue+=resmap[discard1];
    cut++;                         /* update cut  */
    /* here: up -> Unit of the array with bottom digit  */
    /*       cut is the division point for each Unit  */
    /*       quot holds the uncut high-order digits for the current unit  */
    if (set->digits<=0) {          /* special for Quantize/Subnormal :-(  */
      *dn->lsu=0;                  /* .. result is 0  */
      dn->digits=1;                /* ..  */
      }
     else {                        /* shift to least needed  */
      count=set->digits;           /* now digits to end up with  */
      dn->digits=count;            /* set the new length  */
      /* shift-copy the coefficient array to the result number  */
      for (target=dn->lsu; ; target++) {
        *target=(Unit)quot;
        count-=(DECDPUN-cut);
        if (count<=0) break;
        up++;
        quot=*up;
        #if DECDPUN<=4
          quot=QUOT10(quot, cut);
          rem=*up-quot*powers[cut];
        #else
          rem=quot%powers[cut];
          quot=quot/powers[cut];
        #endif
        *target=(Unit)(*target+rem*powers[DECDPUN-cut]);
        count-=cut;
        if (count<=0) break;
        } /* shift-copy loop  */
      } /* shift to least  */
    } /* not unit boundary  */

  if (*residue!=0) *status|=DEC_Inexact; /* record inexactitude  */
  return;
  }